

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_smul_dual(TCGContext_conflict1 *tcg_ctx,TCGv_i32 a,TCGv_i32 b)

{
  TCGTemp *a1;
  TCGTemp *ts;
  uintptr_t o_2;
  TCGv_i32 ret;
  uintptr_t o;
  uintptr_t o_1;
  
  a1 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret,a);
  tcg_gen_ext16s_i32_aarch64(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),b);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_mul_i32,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  tcg_gen_sari_i32_aarch64(tcg_ctx,a,a,0x10);
  tcg_gen_sari_i32_aarch64(tcg_ctx,b,b,0x10);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_mul_i32,(TCGArg)(b + (long)tcg_ctx),
                      (TCGArg)(b + (long)tcg_ctx),(TCGArg)(a + (long)&tcg_ctx->pool_cur));
  if (ret != a) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(a + (long)&tcg_ctx->pool_cur),(TCGArg)a1);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_smul_dual(TCGContext *tcg_ctx, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 tmp1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 tmp2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext16s_i32(tcg_ctx, tmp1, a);
    tcg_gen_ext16s_i32(tcg_ctx, tmp2, b);
    tcg_gen_mul_i32(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);
    tcg_gen_sari_i32(tcg_ctx, a, a, 16);
    tcg_gen_sari_i32(tcg_ctx, b, b, 16);
    tcg_gen_mul_i32(tcg_ctx, b, b, a);
    tcg_gen_mov_i32(tcg_ctx, a, tmp1);
    tcg_temp_free_i32(tcg_ctx, tmp1);
}